

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O3

void __thiscall chrono::ChMarker::ChMarker(ChMarker *this,ChMarker *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double dVar2;
  double dVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ChQuaternion<double> local_58;
  ChVector<double> local_38;
  
  ChObj::ChObj(&this->super_ChObj,&other->super_ChObj);
  ChFrameMoving<double>::ChFrameMoving
            (&this->super_ChFrameMoving<double>,&other->super_ChFrameMoving<double>);
  (this->super_ChObj)._vptr_ChObj = (_func_int **)&PTR__ChMarker_00b034b0;
  (this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)&PTR__ChMarker_00b034f0;
  (this->rest_coord).pos.m_data[0] = 0.0;
  (this->rest_coord).pos.m_data[1] = 0.0;
  (this->rest_coord).pos.m_data[2] = 0.0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_axis).m_data[0] = 0.0;
  (this->motion_axis).m_data[1] = 0.0;
  (this->motion_axis).m_data[2] = 0.0;
  (this->rest_coord).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->rest_coord).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->rest_coord).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->last_rel_coord).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->last_rel_coord).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->last_rel_coord).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->last_rel_coord_dt).rot.m_data[0] = 1.0;
  (this->last_rel_coord_dt).rot.m_data[1] = 0.0;
  (this->last_rel_coord_dt).rot.m_data[2] = 0.0;
  (this->last_rel_coord_dt).rot.m_data[3] = 0.0;
  local_58.m_data[0] = 1.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 0.0;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->abs_frame,&local_38,&local_58);
  this->Body = (ChBody *)0x0;
  iVar4 = (*((other->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  local_58.m_data[0] = (double)CONCAT44(extraout_var,iVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58.m_data + 1),
             (ChFunction *)local_58.m_data[0]);
  dVar3 = local_58.m_data[1];
  dVar2 = local_58.m_data[0];
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  p_Var1 = (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar2;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_data[1]);
    }
  }
  iVar4 = (*((other->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  local_58.m_data[0] = (double)CONCAT44(extraout_var_00,iVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58.m_data + 1),
             (ChFunction *)local_58.m_data[0]);
  dVar3 = local_58.m_data[1];
  dVar2 = local_58.m_data[0];
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  p_Var1 = (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar2;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_data[1]);
    }
  }
  iVar4 = (*((other->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  local_58.m_data[0] = (double)CONCAT44(extraout_var_01,iVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58.m_data + 1),
             (ChFunction *)local_58.m_data[0]);
  dVar3 = local_58.m_data[1];
  dVar2 = local_58.m_data[0];
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  p_Var1 = (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar2;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_data[1]);
    }
  }
  iVar4 = (*((other->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  local_58.m_data[0] = (double)CONCAT44(extraout_var_02,iVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58.m_data + 1),
             (ChFunction *)local_58.m_data[0]);
  dVar3 = local_58.m_data[1];
  dVar2 = local_58.m_data[0];
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  p_Var1 = (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar2;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_data[1]);
    }
  }
  if (other != this) {
    (this->motion_axis).m_data[0] = (other->motion_axis).m_data[0];
    (this->motion_axis).m_data[1] = (other->motion_axis).m_data[1];
    (this->motion_axis).m_data[2] = (other->motion_axis).m_data[2];
    (this->rest_coord).pos.m_data[0] = (other->rest_coord).pos.m_data[0];
    (this->rest_coord).pos.m_data[1] = (other->rest_coord).pos.m_data[1];
    (this->rest_coord).pos.m_data[2] = (other->rest_coord).pos.m_data[2];
    (this->rest_coord).rot.m_data[0] = (other->rest_coord).rot.m_data[0];
    (this->rest_coord).rot.m_data[1] = (other->rest_coord).rot.m_data[1];
    (this->rest_coord).rot.m_data[2] = (other->rest_coord).rot.m_data[2];
    (this->rest_coord).rot.m_data[3] = (other->rest_coord).rot.m_data[3];
  }
  this->motion_type = other->motion_type;
  ChFrameMoving<double>::operator=(&this->abs_frame,&other->abs_frame);
  if (other != this) {
    (this->last_rel_coord).pos.m_data[0] = (other->last_rel_coord).pos.m_data[0];
    (this->last_rel_coord).pos.m_data[1] = (other->last_rel_coord).pos.m_data[1];
    (this->last_rel_coord).pos.m_data[2] = (other->last_rel_coord).pos.m_data[2];
    (this->last_rel_coord).rot.m_data[0] = (other->last_rel_coord).rot.m_data[0];
    (this->last_rel_coord).rot.m_data[1] = (other->last_rel_coord).rot.m_data[1];
    (this->last_rel_coord).rot.m_data[2] = (other->last_rel_coord).rot.m_data[2];
    (this->last_rel_coord).rot.m_data[3] = (other->last_rel_coord).rot.m_data[3];
    (this->last_rel_coord_dt).pos.m_data[0] = (other->last_rel_coord_dt).pos.m_data[0];
    (this->last_rel_coord_dt).pos.m_data[1] = (other->last_rel_coord_dt).pos.m_data[1];
    (this->last_rel_coord_dt).pos.m_data[2] = (other->last_rel_coord_dt).pos.m_data[2];
    (this->last_rel_coord_dt).rot.m_data[0] = (other->last_rel_coord_dt).rot.m_data[0];
    (this->last_rel_coord_dt).rot.m_data[1] = (other->last_rel_coord_dt).rot.m_data[1];
    (this->last_rel_coord_dt).rot.m_data[2] = (other->last_rel_coord_dt).rot.m_data[2];
    (this->last_rel_coord_dt).rot.m_data[3] = (other->last_rel_coord_dt).rot.m_data[3];
  }
  this->last_time = other->last_time;
  return;
}

Assistant:

ChMarker::ChMarker(const ChMarker& other) : ChObj(other), ChFrameMoving<double>(other) {
    Body = NULL;

    motion_X = std::shared_ptr<ChFunction>(other.motion_X->Clone());
    motion_Y = std::shared_ptr<ChFunction>(other.motion_Y->Clone());
    motion_Z = std::shared_ptr<ChFunction>(other.motion_Z->Clone());
    motion_ang = std::shared_ptr<ChFunction>(other.motion_ang->Clone());

    motion_axis = other.motion_axis;

    rest_coord = other.rest_coord;

    motion_type = other.motion_type;

    abs_frame = other.abs_frame;

    last_rel_coord = other.last_rel_coord;
    last_rel_coord_dt = other.last_rel_coord_dt;
    last_time = other.last_time;
}